

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall TestPicker::testEvenDisabled(TestPicker *this)

{
  Object *obj;
  long lVar1;
  char cVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  QPoint pos;
  int iVar6;
  QPoint pos_00;
  QString local_158;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  StringListEvenDisabledModel model;
  QSignalSpy spy;
  QMouseEvent me;
  
  QStringListModel::QStringListModel(&model.super_QStringListModel,(QObject *)0x0);
  model._0_8_ = &PTR_metaObject_0019a450;
  QStringListModel::setStringList((QList *)&model.super_QStringListModel);
  QtMWidgets::Picker::setModel((this->m_picker).value,(QAbstractItemModel *)&model);
  QtMWidgets::Picker::setCurrentIndex((this->m_picker).value,3);
  obj = (this->m_picker).value;
  lVar1 = *(long *)&obj->field_0x20;
  iVar4 = *(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14);
  iVar6 = *(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18);
  QSignalSpy::QSignalSpy<void(QtMWidgets::Picker::*)(int)>(&spy,obj,0x15695e);
  iVar5 = (iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1;
  iVar4 = (iVar6 - (iVar6 + 1 >> 0x1f)) + 1 >> 1;
  pos_00.yp = iVar4;
  pos_00.xp = iVar5;
  QTest::mouseEvent(MousePress,&((this->m_picker).value)->super_QWidget,LeftButton,
                    (KeyboardModifiers)0x0,pos_00,-1);
  local_130 = (double)((this->m_delta).xp + iVar5);
  local_128 = (double)((this->m_delta).yp + iVar4);
  uVar3 = QWidget::mapToGlobal((QPoint *)(this->m_picker).value);
  local_140 = (double)(int)uVar3;
  local_138 = (double)(int)((ulong)uVar3 >> 0x20);
  local_158.d.d = (Data *)0x0;
  local_158.d.ptr = (char16_t *)0x0;
  local_158.d.size = 0;
  uVar3 = QPointingDevice::primaryPointingDevice(&local_158);
  QMouseEvent::QMouseEvent(&me,5,&local_130,&local_140,1,1,0,uVar3);
  if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,8);
    }
  }
  QCoreApplication::sendEvent((QObject *)(this->m_picker).value,(QEvent *)&me);
  QTest::qWait(500);
  pos.xp = iVar5 + (this->m_delta).xp;
  pos.yp = iVar4 + (this->m_delta).yp;
  QTest::mouseEvent(MouseRelease,&((this->m_picker).value)->super_QWidget,LeftButton,
                    (KeyboardModifiers)0x0,pos,0x14);
  QTest::mouseEvent(MouseClick,&((this->m_picker).value)->super_QWidget,LeftButton,
                    (KeyboardModifiers)0x0,pos_00,0x14);
  cVar2 = QTest::qVerify(spy.super_QList<QList<QVariant>_>.d.size == 0,"spy.count() == 0","",
                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/picker/main.cpp"
                         ,0xce);
  if (cVar2 != '\0') {
    QtMWidgets::Picker::setModel((this->m_picker).value,(QAbstractItemModel *)&this->m_model);
  }
  QMouseEvent::~QMouseEvent(&me);
  spy._0_8_ = &PTR_metaObject_0019a368;
  QObject::~QObject((QObject *)&spy.m_loop);
  if (spy.args.d.d != (Data *)0x0) {
    LOCK();
    ((spy.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((spy.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((spy.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(spy.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (spy.sig.d.d != (Data *)0x0) {
    LOCK();
    ((spy.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((spy.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((spy.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(spy.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer(&spy.super_QList<QList<QVariant>_>.d);
  QObject::~QObject(&spy.super_QObject);
  model._0_8_ = QColor::convertTo;
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&model.field_0x10);
  QAbstractListModel::~QAbstractListModel((QAbstractListModel *)&model);
  return;
}

Assistant:

void testEvenDisabled()
	{
		StringListEvenDisabledModel model;
		model.setStringList( m_data );

		m_picker->setModel( &model );

		m_picker->setCurrentIndex( 3 );

		QPoint c( m_picker->width() / 2, m_picker->height() / 2 );

		QSignalSpy spy( m_picker.data(), QOverload< int >::of(
			&QtMWidgets::Picker::currentIndexChanged ) );

		QTest::mousePress( m_picker.data(), Qt::LeftButton, {}, c );
		QMouseEvent me( QEvent::MouseMove, c + m_delta, m_picker->mapToGlobal( c + m_delta ),
			Qt::LeftButton, Qt::LeftButton, {} );
		QApplication::sendEvent( m_picker.data(), &me );
		QTest::qWait( 500 );
		QTest::mouseRelease( m_picker.data(), Qt::LeftButton, {}, c + m_delta, 20 );
		QTest::mouseClick( m_picker.data(), Qt::LeftButton, {}, c, 20 );

		QVERIFY( spy.count() == 0 );

		m_picker->setModel( &m_model );
	}